

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
upb::generator::StripExtension_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view fname)

{
  generator *pgVar1;
  generator *pgVar2;
  size_t sVar3;
  generator *pgVar4;
  
  sVar3 = fname._M_len;
  pgVar4 = this;
  if (this == (generator *)0x0) {
LAB_0026e692:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pgVar2 = this + sVar3;
  }
  else {
    do {
      pgVar2 = pgVar4 + -1;
      if (pgVar4 == (generator *)0x0) goto LAB_0026e692;
      pgVar1 = pgVar4 + (sVar3 - 1);
      pgVar4 = pgVar2;
    } while (*pgVar1 != (generator)0x2e);
    pgVar2 = pgVar2 + sVar3;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,sVar3,pgVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string StripExtension(absl::string_view fname) {
  size_t lastdot = fname.find_last_of('.');
  if (lastdot == std::string::npos) {
    return std::string(fname);
  }
  return std::string(fname.substr(0, lastdot));
}